

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<double,double,double,duckdb::BinaryStandardOperatorWrapper,duckdb::PowOperator,bool>
               (double *ldata,double *rdata,double *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t row_idx;
  idx_t i;
  ulong uVar4;
  idx_t row_idx_00;
  idx_t row_idx_01;
  double dVar5;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = uVar4;
      if (lsel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)lsel->sel_vector[uVar4];
      }
      uVar3 = uVar4;
      if (rsel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)rsel->sel_vector[uVar4];
      }
      dVar5 = pow(ldata[uVar2],rdata[uVar3]);
      result_data[uVar4] = dVar5;
    }
  }
  else {
    for (row_idx_00 = 0; count != row_idx_00; row_idx_00 = row_idx_00 + 1) {
      row_idx_01 = row_idx_00;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)lsel->sel_vector[row_idx_00];
      }
      row_idx = row_idx_00;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)rsel->sel_vector[row_idx_00];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (!bVar1) goto LAB_01d3cf41;
        dVar5 = pow(ldata[row_idx_01],rdata[row_idx]);
        result_data[row_idx_00] = dVar5;
      }
      else {
LAB_01d3cf41:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}